

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_play_back_one_page(Pager *pPager,sxi64 *pOfft,uchar *zTmp)

{
  sxu32 sVar1;
  sxu32 local_44;
  int rc;
  sxu32 ckSum;
  pgno iNum;
  sxi64 iOfft;
  uchar *zData;
  uchar *zTmp_local;
  sxi64 *pOfft_local;
  Pager *pPager_local;
  
  iNum = *pOfft;
  iOfft = (sxi64)zTmp;
  zData = zTmp;
  zTmp_local = (uchar *)pOfft;
  pOfft_local = (sxi64 *)pPager;
  pPager_local._4_4_ = ReadInt64(pPager->pjfd,(sxu64 *)&rc,iNum);
  if (pPager_local._4_4_ == 0) {
    iNum = iNum + 8;
    pPager_local._4_4_ =
         unqliteOsRead((unqlite_file *)pOfft_local[7],(void *)iOfft,(long)(int)pOfft_local[0x41],
                       iNum);
    if (pPager_local._4_4_ == 0) {
      iNum = (long)(int)pOfft_local[0x41] + iNum;
      pPager_local._4_4_ = ReadInt32((unqlite_file *)pOfft_local[7],&local_44,iNum);
      if (pPager_local._4_4_ == 0) {
        iNum = iNum + 4;
        *(pgno *)zTmp_local = iNum;
        sVar1 = pager_cksum((Pager *)pOfft_local,(uchar *)iOfft);
        if (local_44 == sVar1) {
          if (_rc < (ulong)pOfft_local[8]) {
            pPager_local._4_4_ =
                 unqliteOsWrite((unqlite_file *)pOfft_local[6],(void *)iOfft,
                                (long)(int)pOfft_local[0x41],_rc * (long)(int)pOfft_local[0x41]);
            if (pPager_local._4_4_ == 0) {
              pager_fill_page((Pager *)pOfft_local,_rc,(void *)iOfft);
            }
          }
          else {
            pPager_local._4_4_ = 0;
          }
        }
        else {
          pPager_local._4_4_ = -0x3f;
        }
      }
    }
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_play_back_one_page(Pager *pPager,sxi64 *pOfft,unsigned char *zTmp)
{
	unsigned char *zData = zTmp;
	sxi64 iOfft; /* Offset to read from */
	pgno iNum;   /* Pager number */
	sxu32 ckSum; /* Sanity check */
	int rc;
	/* Offset to start reading from */
	iOfft = *pOfft;
	/* Database page number */
	rc = ReadInt64(pPager->pjfd,&iNum,iOfft);
	if( rc != UNQLITE_OK ){ return rc; }
	iOfft += 8;
	/* Page data */
	rc = unqliteOsRead(pPager->pjfd,zData,pPager->iPageSize,iOfft);
	if( rc != UNQLITE_OK ){ return rc; }
	iOfft += pPager->iPageSize;
	/* Page cksum */
	rc = ReadInt32(pPager->pjfd,&ckSum,iOfft);
	if( rc != UNQLITE_OK ){ return rc; }
	iOfft += 4;
	/* Synchronize pointers */
	*pOfft = iOfft;
	/* Make sure we are dealing with a valid page */
	if( ckSum != pager_cksum(pPager,zData) ){
		/* Ignore that page */
		return SXERR_IGNORE;
	}
	if( iNum >= pPager->dbSize ){
		/* Ignore that page */
		return UNQLITE_OK;
	}
	/* playback */
	rc = unqliteOsWrite(pPager->pfd,zData,pPager->iPageSize,iNum * pPager->iPageSize);
	if( rc == UNQLITE_OK ){
		/* Flush the cache */
		pager_fill_page(pPager,iNum,zData);
	}
	return rc;
}